

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_1048b1::pp_lifo::emplace(pp_lifo *this,int variable,bool value)

{
  pointer __src;
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  pointer ppVar6;
  ulong uVar7;
  ulong __n;
  
  __src = (this->data).
          super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->data).
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)ppVar2 - (long)__src;
  ppVar1 = __src;
  uVar5 = __n;
  if (0 < (long)__n >> 5) {
    lVar4 = ((long)__n >> 5) + 1;
    ppVar6 = __src + 2;
    ppVar1 = (pointer)((long)&__src->index + (__n & 0xffffffffffffffe0));
    do {
      if (ppVar6[-2].index == variable) {
        ppVar6 = ppVar6 + -2;
        goto LAB_00133631;
      }
      if (ppVar6[-1].index == variable) {
        ppVar6 = ppVar6 + -1;
        goto LAB_00133631;
      }
      if (ppVar6->index == variable) goto LAB_00133631;
      if (ppVar6[1].index == variable) {
        ppVar6 = ppVar6 + 1;
        goto LAB_00133631;
      }
      lVar4 = lVar4 + -1;
      ppVar6 = ppVar6 + 4;
    } while (1 < lVar4);
    uVar5 = (long)ppVar2 - (long)ppVar1;
  }
  lVar4 = (long)uVar5 >> 3;
  if (lVar4 == 1) {
LAB_00133615:
    ppVar6 = ppVar1;
    if (ppVar1->index != variable) {
      ppVar6 = ppVar2;
    }
LAB_00133631:
    if (ppVar6 != ppVar2) goto LAB_001336fa;
  }
  else {
    if (lVar4 == 2) {
LAB_0013360c:
      ppVar6 = ppVar1;
      if (ppVar1->index != variable) {
        ppVar1 = ppVar1 + 1;
        goto LAB_00133615;
      }
      goto LAB_00133631;
    }
    if (lVar4 == 3) {
      ppVar6 = ppVar1;
      if (ppVar1->index != variable) {
        ppVar1 = ppVar1 + 1;
        goto LAB_0013360c;
      }
      goto LAB_00133631;
    }
  }
  if (ppVar2 == (this->data).
                super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar7 = (long)__n >> 3;
    uVar5 = 1;
    if (ppVar2 != __src) {
      uVar5 = uVar7;
    }
    uVar3 = uVar5 + uVar7;
    if (0xffffffffffffffe < uVar3) {
      uVar3 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar5,uVar7)) {
      uVar3 = 0xfffffffffffffff;
    }
    if (uVar3 == 0) {
      ppVar1 = (pointer)0x0;
    }
    else {
      ppVar1 = (pointer)operator_new(uVar3 * 8);
    }
    ppVar1[uVar7].index = variable;
    ppVar1[uVar7].value = value;
    if (0 < (long)__n) {
      memmove(ppVar1,__src,__n);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)(this->data).
                                  super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    ppVar2 = ppVar1 + uVar3;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar1;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppVar1 + __n + 8);
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
  }
  else {
    ppVar2->index = variable;
    ppVar2->value = value;
    ppVar2 = ppVar2 + 1;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
LAB_001336fa:
  return SUB81(ppVar2,0);
}

Assistant:

bool emplace(int variable, bool value)
    {
        auto it = std::find_if(
          data.cbegin(), data.cend(), [&variable](const auto& elem) {
              return elem.index == variable;
          });

        if (it != data.cend())
            return false;

        data.emplace_back(variable, value);

        return true;
    }